

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O0

void __thiscall license::locate::EnvironmentVarData::EnvironmentVarData(EnvironmentVarData *this)

{
  allocator local_31;
  string local_30;
  EnvironmentVarData *local_10;
  EnvironmentVarData *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"EnvironmentVarData",&local_31);
  LocatorStrategy::LocatorStrategy(&this->super_LocatorStrategy,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__002186d0;
  this->isBase64 = false;
  return;
}

Assistant:

EnvironmentVarData::EnvironmentVarData() : LocatorStrategy("EnvironmentVarData") {}